

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::getActualMinimum(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  int local_3c;
  int32_t result;
  Calendar *work;
  int32_t endValue;
  int32_t fieldValue;
  UErrorCode *status_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  Calendar *this_00;
  
  local_3c = (*(this->super_UObject)._vptr_UObject[0x12])(this,(ulong)field);
  iVar2 = (*(this->super_UObject)._vptr_UObject[0xe])(this,(ulong)field);
  this_local._4_4_ = local_3c;
  if (local_3c != iVar2) {
    iVar3 = (*(this->super_UObject)._vptr_UObject[3])();
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar3);
    if (this_00 == (Calendar *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      setLenient(this_00,'\x01');
      work._4_4_ = local_3c;
      do {
        set(this_00,field,work._4_4_);
        iVar4 = get(this_00,field,status);
        if (iVar4 != work._4_4_) break;
        local_3c = work._4_4_;
        work._4_4_ = work._4_4_ + -1;
      } while (iVar2 <= work._4_4_);
      if (this_00 != (Calendar *)0x0) {
        (*(this_00->super_UObject)._vptr_UObject[1])();
      }
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        this_local._4_4_ = local_3c;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t
Calendar::getActualMinimum(UCalendarDateFields field, UErrorCode& status) const
{
    int32_t fieldValue = getGreatestMinimum(field);
    int32_t endValue = getMinimum(field);

    // if we know that the minimum value is always the same, just return it
    if (fieldValue == endValue) {
        return fieldValue;
    }

    // clone the calendar so we don't mess with the real one, and set it to
    // accept anything for the field values
    Calendar *work = (Calendar*)this->clone();
    if (work == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    work->setLenient(TRUE);

    // now try each value from getLeastMaximum() to getMaximum() one by one until
    // we get a value that normalizes to another value.  The last value that
    // normalizes to itself is the actual minimum for the current date
    int32_t result = fieldValue;

    do {
        work->set(field, fieldValue);
        if (work->get(field, status) != fieldValue) {
            break;
        }
        else {
            result = fieldValue;
            fieldValue--;
        }
    } while (fieldValue >= endValue);

    delete work;

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0;
    }
    return result;
}